

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode parseurl(char *url,CURLU *u,uint flags)

{
  char *pcVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  CURLUcode CVar6;
  CURLUcode CVar7;
  size_t sVar8;
  byte *pbVar9;
  undefined7 extraout_var;
  char *pcVar10;
  Curl_handler *pCVar11;
  byte *__s1;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  bool bVar15;
  char *hostname;
  char schemebuf [41];
  char *local_90;
  byte *local_88;
  byte *local_80;
  char *local_78;
  byte *local_70;
  char local_68 [56];
  
  sVar8 = strlen(url);
  if (8000000 < sVar8) {
LAB_001456f6:
    CVar7 = CURLUE_MALFORMED_INPUT;
    goto LAB_00145d4d;
  }
  pbVar9 = (byte *)(*Curl_cmalloc)(sVar8 * 2 + 2);
  u->scratch = (char *)pbVar9;
  if (pbVar9 == (byte *)0x0) {
LAB_00145d47:
    CVar7 = CURLUE_OUT_OF_MEMORY;
  }
  else {
    local_88 = pbVar9 + sVar8 + 1;
    pbVar9[sVar8 + 1] = 0;
    local_80 = local_88;
    _Var3 = Curl_is_absolute_url(url,local_68,0x29);
    CVar7 = (CURLUcode)CONCAT71(extraout_var,_Var3);
    if (_Var3) {
      sVar8 = strlen(local_68);
      local_90 = local_68;
      iVar4 = Curl_strcasecompare(local_90,"file");
      if (iVar4 == 0) {
        *pbVar9 = 0;
        if (!_Var3) goto LAB_001457fc;
        pcVar10 = url + sVar8 + 1;
        bVar15 = true;
        pcVar1 = url + sVar8 + 1;
        url = pcVar10;
        if (*pcVar1 == '/') {
          uVar5 = 0xffffffff;
          do {
            uVar5 = uVar5 + 1;
            pcVar1 = pcVar10 + 1;
            pcVar10 = pcVar10 + 1;
            if (*pcVar1 != '/') break;
          } while (uVar5 < 3);
          bVar15 = 2 < uVar5;
          url = pcVar10;
        }
        CVar7 = CURLUE_MALFORMED_INPUT;
        if (bVar15) {
          local_90 = (char *)0x0;
          CVar7 = CURLUE_MALFORMED_INPUT;
LAB_0014597e:
          bVar15 = false;
        }
        else {
          pCVar11 = Curl_builtin_scheme(local_68);
          if ((flags & 8) == 0 && pCVar11 == (Curl_handler *)0x0) {
            CVar7 = CURLUE_UNSUPPORTED_SCHEME;
            goto LAB_0014597e;
          }
          local_90 = local_68;
          CVar6 = junkscan(local_90);
          bVar15 = CVar6 == CURLUE_OK;
        }
        if (!bVar15) goto LAB_001458c5;
        goto LAB_0014581f;
      }
      strcpy((char *)pbVar9,url + 5);
      local_88 = (byte *)0x0;
      pcVar10 = (*Curl_cstrdup)("file");
      u->scheme = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_00145d47;
      pbVar13 = pbVar9;
      if ((*pbVar9 == 0x2f) && (pbVar9[1] == 0x2f)) {
        pbVar13 = pbVar9 + 2;
        bVar15 = true;
        if ((pbVar9[2] != 0x2f) &&
           (((0x19 < (byte)((pbVar9[2] & 0xdf) + 0xbf) ||
             ((pbVar9[3] != 0x7c && (pbVar9[3] != 0x3a)))) ||
            ((bVar2 = pbVar9[4], bVar2 != 0 && ((bVar2 != 0x2f && (bVar2 != 0x5c)))))))) {
          iVar4 = curl_strnequal("localhost/",(char *)pbVar13,10);
          if ((iVar4 == 0) && (iVar4 = curl_strnequal("127.0.0.1/",(char *)pbVar13,10), iVar4 == 0))
          {
            bVar15 = false;
            pbVar13 = pbVar9;
          }
          else {
            pbVar13 = pbVar9 + 0xb;
          }
        }
        if (!bVar15) goto LAB_001456f6;
      }
      if ((((*pbVar13 == 0x2f) && ((byte)((pbVar13[1] & 0xdf) + 0xbf) < 0x1a)) &&
          ((pbVar13[2] == 0x7c || (pbVar13[2] == 0x3a)))) &&
         (((bVar2 = pbVar13[3], bVar2 == 0 || (bVar2 == 0x2f)) || (bVar2 == 0x5c))))
      goto LAB_001456f6;
      CVar6 = CURLUE_MALFORMED_INPUT;
      CVar7 = CURLUE_MALFORMED_INPUT;
      pbVar9 = pbVar13;
      if ((((byte)((*pbVar13 & 0xdf) + 0xbf) < 0x1a) &&
          ((pbVar13[1] == 0x7c || (pbVar13[1] == 0x3a)))) &&
         ((bVar2 = pbVar13[2], bVar2 == 0 || ((bVar2 == 0x2f || (bVar2 == 0x5c))))))
      goto LAB_00145d4d;
    }
    else {
      *pbVar9 = 0;
LAB_001457fc:
      if ((flags & 0x204) == 0) {
        CVar7 = CURLUE_MALFORMED_INPUT;
LAB_001458c5:
        bVar15 = false;
      }
      else {
        local_90 = (char *)0x0;
        if ((flags & 4) != 0) {
          local_90 = "https";
        }
LAB_0014581f:
        pbVar13 = local_80;
        sVar8 = 0;
        while ((0x3f < (ulong)(byte)url[sVar8] ||
               ((0x8000800800000001U >> ((ulong)(byte)url[sVar8] & 0x3f) & 1) == 0))) {
          sVar8 = sVar8 + 1;
        }
        if (sVar8 == 0) {
          bVar15 = false;
          CVar7 = CURLUE_MALFORMED_INPUT;
        }
        else {
          local_78 = url + sVar8;
          local_70 = pbVar9;
          memcpy(local_80,url,sVar8);
          pbVar9 = local_70;
          pbVar13[sVar8] = 0;
          if (local_90 == (char *)0x0 && (flags >> 9 & 1) != 0) {
            iVar4 = curl_strnequal("ftp.",(char *)pbVar13,4);
            if (iVar4 == 0) {
              iVar4 = curl_strnequal("dict.",(char *)pbVar13,5);
              if (iVar4 == 0) {
                iVar4 = curl_strnequal("ldap.",(char *)pbVar13,5);
                if (iVar4 == 0) {
                  iVar4 = curl_strnequal("imap.",(char *)pbVar13,5);
                  if (iVar4 == 0) {
                    iVar4 = curl_strnequal("smtp.",(char *)pbVar13,5);
                    if (iVar4 == 0) {
                      iVar4 = curl_strnequal("pop3.",(char *)pbVar13,5);
                      local_90 = "pop3";
                      if (iVar4 == 0) {
                        local_90 = "http";
                      }
                    }
                    else {
                      local_90 = "smtp";
                    }
                  }
                  else {
                    local_90 = "imap";
                  }
                }
                else {
                  local_90 = "ldap";
                }
              }
              else {
                local_90 = "dict";
              }
            }
            else {
              local_90 = "ftp";
            }
          }
          pcVar10 = local_78;
          sVar8 = strlen(local_78);
          memcpy(pbVar9,pcVar10,sVar8);
          pbVar9[sVar8] = 0;
          pcVar10 = (*Curl_cstrdup)(local_90);
          u->scheme = pcVar10;
          bVar15 = pcVar10 != (char *)0x0;
          if (!bVar15) {
            CVar7 = CURLUE_OUT_OF_MEMORY;
          }
        }
      }
      CVar6 = CVar7;
      if (!bVar15) goto LAB_00145d4d;
    }
    CVar7 = CVar6;
    pCVar11 = Curl_builtin_scheme(u->scheme);
    CVar6 = junkscan((char *)pbVar9);
    if (CVar6 != CURLUE_OK) goto LAB_001456f6;
    pcVar10 = strchr((char *)pbVar9,0x3f);
    if (pcVar10 == (char *)0x0) {
      pbVar13 = (byte *)0x0;
    }
    else {
      pbVar13 = (byte *)(pcVar10 + 1);
      *pcVar10 = '\0';
    }
    pbVar12 = pbVar13;
    if (pbVar13 == (byte *)0x0) {
      pbVar12 = pbVar9;
    }
    pcVar10 = strchr((char *)pbVar12,0x23);
    if (pcVar10 == (char *)0x0) {
      pbVar12 = (byte *)0x0;
    }
    else {
      pbVar12 = (byte *)(pcVar10 + 1);
      *pcVar10 = '\0';
    }
    if (*pbVar9 == 0) {
      bVar15 = false;
      pbVar9 = (byte *)0x0;
    }
    else if ((flags & 0x10) == 0) {
      local_80 = pbVar12;
      __s1 = (byte *)Curl_dedotdotify((char *)pbVar9);
      if (__s1 == (byte *)0x0) {
        CVar7 = CURLUE_OUT_OF_MEMORY;
LAB_00145c46:
        bVar15 = false;
        pbVar14 = pbVar9;
      }
      else {
        iVar4 = strcmp((char *)__s1,(char *)pbVar9);
        bVar15 = iVar4 != 0;
        pbVar14 = __s1;
        if (iVar4 == 0) {
          (*Curl_cfree)(__s1);
          goto LAB_00145c46;
        }
      }
      pbVar12 = local_80;
      pbVar9 = pbVar14;
      if (__s1 == (byte *)0x0) goto LAB_00145d4d;
    }
    else {
      bVar15 = false;
    }
    if (pbVar9 != (byte *)0x0) {
      if (!bVar15) {
        pbVar9 = (byte *)(*Curl_cstrdup)((char *)pbVar9);
      }
      u->path = (char *)pbVar9;
      if (pbVar9 == (byte *)0x0) goto LAB_00145d47;
    }
    if (local_88 != (byte *)0x0) {
      CVar6 = junkscan((char *)local_88);
      CVar7 = CURLUE_MALFORMED_INPUT;
      if ((((CVar6 != CURLUE_OK) ||
           (CVar7 = parse_hostname_login(u,pCVar11,(char **)&local_88,flags), pbVar9 = local_88,
           CVar7 != CURLUE_OK)) || (CVar7 = Curl_parse_port(u,(char *)local_88), CVar7 != CURLUE_OK)
          ) || (CVar7 = hostname_check(u,(char *)pbVar9), CVar7 != CURLUE_OK)) goto LAB_00145d4d;
      pcVar10 = (*Curl_cstrdup)((char *)pbVar9);
      u->host = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_00145d47;
    }
    if (pbVar13 != (byte *)0x0) {
      pcVar10 = (*Curl_cstrdup)((char *)pbVar13);
      u->query = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_00145d47;
    }
    if ((pbVar12 != (byte *)0x0) && (*pbVar12 != 0)) {
      pcVar10 = (*Curl_cstrdup)((char *)pbVar12);
      u->fragment = pcVar10;
      CVar7 = CURLUE_OUT_OF_MEMORY;
      if (pcVar10 == (char *)0x0) goto LAB_00145d4d;
    }
    (*Curl_cfree)(u->scratch);
    u->scratch = (char *)0x0;
    CVar7 = CURLUE_OK;
  }
LAB_00145d4d:
  if (CVar7 != CURLUE_OK) {
    free_urlhandle(u);
    u->scratch = (char *)0x0;
    u->portnum = 0;
    u->query = (char *)0x0;
    u->fragment = (char *)0x0;
    u->port = (char *)0x0;
    u->path = (char *)0x0;
    u->host = (char *)0x0;
    u->zoneid = (char *)0x0;
    u->password = (char *)0x0;
    u->options = (char *)0x0;
    u->scheme = (char *)0x0;
    u->user = (char *)0x0;
  }
  return CVar7;
}

Assistant:

static CURLUcode parseurl(const char *url, CURLU *u, unsigned int flags)
{
  CURLUcode result = seturl(url, u, flags);
  if(result) {
    free_urlhandle(u);
    memset(u, 0, sizeof(struct Curl_URL));
  }
  return result;
}